

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O2

void __thiscall Buffer_add_readonly_Test::~Buffer_add_readonly_Test(Buffer_add_readonly_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, add_readonly) {
    auto buf = bfy_buffer_init();

    // add a read-only string.
    // it should show up as readable in the buffer.
    EXPECT_EQ(0, bfy_buffer_add_readonly(&buf, std::data(str1), std::size(str1)));
    auto expected_readable_size = std::size(str1);
    EXPECT_EQ(expected_readable_size, bfy_buffer_get_content_len(&buf));
    EXPECT_EQ(0, bfy_buffer_get_space_len(&buf));

    // add another, to test that buffer knows the end page is readonly
    // and will allocate another page.
    EXPECT_EQ(0, bfy_buffer_add_readonly(&buf, std::data(str2), std::size(str2)));
    expected_readable_size += std::size(str2);
    EXPECT_EQ(expected_readable_size, bfy_buffer_get_content_len(&buf));
    EXPECT_EQ(0, bfy_buffer_get_space_len(&buf));

    bfy_buffer_destruct(&buf);
}